

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::If_AST_Node::eval_internal(If_AST_Node *this,Dispatch_State *t_ss)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Dispatch_Engine *pDVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long lVar7;
  undefined8 *puVar8;
  ulong uVar9;
  Boxed_Value BVar10;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  AST_Node::eval((AST_Node *)&stack0xffffffffffffffc0,
                 (Dispatch_State *)
                 ((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base._M_mutex.
                 __align);
  bVar1 = AST_Node::get_bool_condition((Boxed_Value *)&stack0xffffffffffffffc0);
  if (local_38 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
  }
  if (bVar1) {
    BVar10 = AST_Node::eval(&this->super_AST_Node,
                            *(Dispatch_State **)
                             ((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.
                                     super___mutex_base._M_mutex + 0x10));
    _Var6._M_pi = BVar10.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  else {
    if (0x20 < (ulong)((long)t_ss[3].m_stack_holder._M_data - (long)t_ss[3].m_engine._M_data)) {
      pDVar4 = t_ss[3].m_engine._M_data;
      bVar1 = 0x20 < (ulong)((long)t_ss[3].m_stack_holder._M_data - (long)pDVar4);
      if (bVar1) {
        uVar9 = 2;
        lVar7 = 0x40;
        do {
          iVar3 = std::__cxx11::string::compare
                            ((char *)(*(long *)((long)pDVar4 + lVar7 + -0x20) + 0x20));
          pDVar4 = t_ss[3].m_engine._M_data;
          if (iVar3 == 0) {
            puVar8 = (undefined8 *)((long)pDVar4 + lVar7 + -0x10);
LAB_001a8ce6:
            BVar10 = AST_Node::eval(&this->super_AST_Node,(Dispatch_State *)*puVar8);
            _Var6._M_pi = BVar10.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi;
            if (bVar1) goto LAB_001a8d4d;
            break;
          }
          iVar3 = std::__cxx11::string::compare
                            ((char *)(*(long *)((long)pDVar4 + lVar7 + -0x20) + 0x20));
          if (iVar3 == 0) {
            AST_Node::eval((AST_Node *)&stack0xffffffffffffffc0,
                           *(Dispatch_State **)((long)t_ss[3].m_engine._M_data + lVar7 + -0x10));
            bVar2 = AST_Node::get_bool_condition((Boxed_Value *)&stack0xffffffffffffffc0);
            if (local_38 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
            }
            if (bVar2) {
              puVar8 = (undefined8 *)
                       ((long)&((t_ss[3].m_engine._M_data)->m_mutex).super_mutex.super___mutex_base.
                               _M_mutex + lVar7);
              goto LAB_001a8ce6;
            }
          }
          uVar9 = uVar9 + 3;
          pDVar4 = t_ss[3].m_engine._M_data;
          lVar7 = lVar7 + 0x30;
          bVar1 = uVar9 < (ulong)((long)t_ss[3].m_stack_holder._M_data - (long)pDVar4 >> 4);
        } while (bVar1);
      }
    }
    (this->super_AST_Node)._vptr_AST_Node = (_func_int **)0x0;
    peVar5 = (element_type *)operator_new(0x50);
    (peVar5->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
    super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x100000001;
    peVar5->_vptr_AST_Node = (_func_int **)&PTR___Sp_counted_ptr_inplace_003110a8;
    (peVar5->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
    super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)&peVar5->identifier = 0;
    *(undefined4 *)&(peVar5->text)._M_dataplus._M_p = 0x20;
    (peVar5->text)._M_string_length = 0;
    (peVar5->text).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)&(peVar5->text).field_2 + 8) = 0;
    (peVar5->location).start.line = 0;
    (peVar5->location).start.column = 0;
    *(undefined2 *)&(peVar5->location).end.line = 0;
    (this->super_AST_Node).super_enable_shared_from_this<chaiscript::AST_Node>._M_weak_this.
    super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    (this->super_AST_Node)._vptr_AST_Node =
         (_func_int **)
         &(peVar5->super_enable_shared_from_this<chaiscript::AST_Node>)._M_weak_this.
          super___weak_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    _Var6._M_pi = extraout_RDX;
  }
LAB_001a8d4d:
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{

          if (get_bool_condition(children[0]->eval(t_ss))) {
            return children[1]->eval(t_ss);
          } else {
            if (children.size() > 2) {
              size_t i = 2;
              while (i < children.size()) {
                if (children[i]->text == "else") {
                  return children[i+1]->eval(t_ss);
                }
                else if (children[i]->text == "else if") {
                  if (get_bool_condition(children[i+1]->eval(t_ss))) {
                    return children[i+2]->eval(t_ss);
                  }
                }
                i += 3;
              }
            }
          }

          return Boxed_Value();
        }